

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Matchers::StdString::StringMatcherBase::StringMatcherBase
          (StringMatcherBase *this,string *operation,CasedString *comparator)

{
  string *in_RSI;
  CasedString *in_RDI;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffd0;
  
  Impl::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  MatcherBase(in_stack_ffffffffffffffd0);
  *(undefined ***)in_RDI = &PTR__StringMatcherBase_00250ee0;
  *(undefined **)(in_RDI + 1) = &DAT_00250f08;
  CasedString::CasedString((CasedString *)&in_RDI[1].m_str,in_RDI);
  std::__cxx11::string::string((string *)&in_RDI[2].m_str,in_RSI);
  return;
}

Assistant:

StringMatcherBase::StringMatcherBase( std::string const& operation, CasedString const& comparator )
        : m_comparator( comparator ),
          m_operation( operation ) {
        }